

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O2

bool_t ec2SeemsValidGroup(ec_o *ec,void *stack)

{
  long *plVar1;
  bool_t bVar2;
  int iVar3;
  size_t sVar4;
  word wVar5;
  size_t sVar6;
  size_t sVar7;
  void *stack_00;
  word *b;
  uint uVar8;
  word *b_00;
  
  sVar7 = ec->f->n;
  bVar2 = ecIsOperableGroup(ec);
  uVar8 = 0;
  if (bVar2 != 0) {
    stack_00 = (void *)((long)stack + sVar7 * 0x20 + 0x18);
    bVar2 = ec2IsOnA(ec->base,ec,stack_00);
    if (bVar2 != 0) {
      b = (word *)((long)stack + sVar7 * 8 + 8);
      sVar6 = sVar7 + 1;
      wwSetZero((word *)stack,sVar6);
      sVar4 = gf2Deg(ec->f);
      wwFlipBit((word *)stack,sVar4);
      wVar5 = zzMulW(b,ec->order,sVar6,ec->cofactor);
      *(word *)((long)stack + sVar7 * 0x10 + 0x10) = wVar5;
      sVar4 = sVar7 + 2;
      wVar5 = zzSubW2(b,sVar4,1);
      if (wVar5 == 0) {
        iVar3 = wwCmp2(b,sVar4,(word *)stack,sVar6);
        if (iVar3 < 0) {
          zzSub(b,(word *)stack,b,sVar6);
        }
        else {
          wVar5 = zzSub2(b,(word *)stack,sVar6);
          plVar1 = (long *)((long)stack + sVar7 * 0x10 + 0x10);
          *plVar1 = *plVar1 - wVar5;
        }
        sVar6 = wwWordSize(b,sVar4);
        uVar8 = 0;
        if (sVar6 <= ec->f->n) {
          b_00 = (word *)((long)stack + sVar7 * 0x10 + 0x18);
          zzSqr(b_00,b,sVar6,stack_00);
          sVar7 = gf2Deg(ec->f);
          wwFlipBit((word *)stack,sVar7);
          sVar7 = gf2Deg(ec->f);
          wwFlipBit((word *)stack,sVar7 + 2);
          iVar3 = wwCmp2(b_00,sVar6 * 2,b_00,ec->f->n + 1);
          uVar8 = (uint)(iVar3 < 1);
        }
      }
      else {
        uVar8 = 0;
      }
    }
  }
  return uVar8;
}

Assistant:

bool_t ec2SeemsValidGroup(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n + 1;
	word* t3 = t2 + n + 2;
	stack = t3 + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec));
	// ecIsOperableGroup(ec) == TRUE? base \in ec?
	if (!ecIsOperableGroup(ec) ||
		!ec2IsOnA(ec->base, ec, stack))
		return FALSE;
	// [n + 1]t1 <- 2^m
	wwSetZero(t1, n + 1);
	wwFlipBit(t1, gf2Deg(ec->f));
	// [n + 2]t2 <- order * cofactor
	t2[n + 1] = zzMulW(t2, ec->order, n + 1, ec->cofactor);
	// t2 <- |t2 - (2^m + 1)|
	if (zzSubW2(t2, n + 2, 1))
		return FALSE;
	if (wwCmp2(t2, n + 2, t1, n + 1) >= 0)
		t2[n + 1] -= zzSub2(t2, t1, n + 1);
	else
		zzSub(t2, t1, t2, n + 1);
	// n <- длина t2
	n = wwWordSize(t2, n + 2);
	// n > ec->f->n => t2^2 > 4 2^m
	if (n > ec->f->n)
		return FALSE;
	// [2n]t3 <- ([n]t2)^2
	zzSqr(t3, t2, n, stack);
	// t1 <- 4 2^m
	wwFlipBit(t1, gf2Deg(ec->f));
	wwFlipBit(t1, gf2Deg(ec->f) + 2);
	// условие Хассе: t3 <= 4 2^m?
	return wwCmp2(t3, 2 * n, t3, ec->f->n + 1) <= 0;
}